

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Track.cpp
# Opt level: O3

bool __thiscall Track::has_good_data(Track *this)

{
  pointer pSVar1;
  bool bVar2;
  long lVar3;
  __normal_iterator<const_Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_> in_RSI;
  long lVar4;
  pointer this_00;
  pointer pSVar5;
  
  this_00 = (this->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
            super__Vector_impl_data._M_start;
  pSVar1 = (this->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar4 = (long)pSVar1 - (long)this_00;
  if (0 < lVar4 >> 8) {
    lVar3 = (lVar4 >> 8) + 1;
    do {
      bVar2 = __gnu_cxx::__ops::_Iter_pred<Track::has_good_data()const::$_0>::operator()
                        ((_Iter_pred<Track::has_good_data()const::__0> *)this_00,in_RSI);
      pSVar5 = this_00;
      if (bVar2) goto LAB_001711ea;
      bVar2 = __gnu_cxx::__ops::_Iter_pred<Track::has_good_data()const::$_0>::operator()
                        ((_Iter_pred<Track::has_good_data()const::__0> *)(this_00 + 1),in_RSI);
      pSVar5 = this_00 + 1;
      if (bVar2) goto LAB_001711ea;
      bVar2 = __gnu_cxx::__ops::_Iter_pred<Track::has_good_data()const::$_0>::operator()
                        ((_Iter_pred<Track::has_good_data()const::__0> *)(this_00 + 2),in_RSI);
      pSVar5 = this_00 + 2;
      if (bVar2) goto LAB_001711ea;
      bVar2 = __gnu_cxx::__ops::_Iter_pred<Track::has_good_data()const::$_0>::operator()
                        ((_Iter_pred<Track::has_good_data()const::__0> *)(this_00 + 3),in_RSI);
      pSVar5 = this_00 + 3;
      if (bVar2) goto LAB_001711ea;
      this_00 = this_00 + 4;
      lVar3 = lVar3 + -1;
      lVar4 = lVar4 + -0x100;
    } while (1 < lVar3);
  }
  lVar4 = lVar4 >> 6;
  if (lVar4 != 1) {
    if (lVar4 != 2) {
      pSVar5 = pSVar1;
      if ((lVar4 != 3) ||
         (bVar2 = __gnu_cxx::__ops::_Iter_pred<Track::has_good_data()const::$_0>::operator()
                            ((_Iter_pred<Track::has_good_data()const::__0> *)this_00,in_RSI),
         pSVar5 = this_00, bVar2)) goto LAB_001711ea;
      this_00 = this_00 + 1;
    }
    bVar2 = __gnu_cxx::__ops::_Iter_pred<Track::has_good_data()const::$_0>::operator()
                      ((_Iter_pred<Track::has_good_data()const::__0> *)this_00,in_RSI);
    pSVar5 = this_00;
    if (bVar2) goto LAB_001711ea;
    this_00 = this_00 + 1;
  }
  bVar2 = __gnu_cxx::__ops::_Iter_pred<Track::has_good_data()const::$_0>::operator()
                    ((_Iter_pred<Track::has_good_data()const::__0> *)this_00,in_RSI);
  pSVar5 = pSVar1;
  if (bVar2) {
    pSVar5 = this_00;
  }
LAB_001711ea:
  return pSVar5 == (this->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
                   super__Vector_impl_data._M_finish;
}

Assistant:

bool Track::has_good_data() const
{
    auto it = std::find_if(begin(), end(), [](const Sector& sector) {
        if (sector.is_8k_sector() && sector.has_data())
        {
            const Data& data = sector.data_copy();
            if (!ChecksumMethods(data.data(), data.size()).empty())
                return false;
        }
        return !sector.has_good_data();
        });

    return it == end();
}